

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O0

void __thiscall
kratos::SystemVerilogCodeGen::stmt_code(SystemVerilogCodeGen *this,SequentialStmtBlock *stmt)

{
  char cVar1;
  bool bVar2;
  uint32_t uVar3;
  int iVar4;
  ulong uVar5;
  basic_ostream<char,_std::char_traits<char>_> *pbVar6;
  ostream *poVar7;
  vector<kratos::EventControl,_std::allocator<kratos::EventControl>_> *this_00;
  SystemVerilogCodeGen *this_01;
  uint64_t uVar8;
  undefined4 extraout_var;
  string *in_R8;
  string local_188;
  string_view local_168;
  ulong local_158;
  uint64_t i;
  allocator<char> local_129;
  string local_128 [32];
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_100;
  undefined1 local_f8 [8];
  string sensitive_list_str;
  string local_b8;
  anon_class_8_1_8991fb9c local_98;
  anon_class_8_1_8991fb9c func;
  EventControl *event_control;
  iterator __end1;
  iterator __begin1;
  vector<kratos::EventControl,_std::allocator<kratos::EventControl>_> *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sensitive_list;
  string local_48;
  string_view local_28;
  SequentialStmtBlock *local_18;
  SequentialStmtBlock *stmt_local;
  SystemVerilogCodeGen *this_local;
  
  local_18 = stmt;
  stmt_local = (SequentialStmtBlock *)this;
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    local_28 = indent(this);
    pbVar6 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                             &(this->stream_).super_stringstream.field_0x10,local_28);
    poVar7 = std::operator<<(pbVar6,"// ");
    strip_newline(&local_48,&(local_18->super_StmtBlock).super_Stmt.super_IRNode.comment);
    poVar7 = std::operator<<(poVar7,(string *)&local_48);
    cVar1 = Stream::endl(&this->stream_);
    std::operator<<(poVar7,cVar1);
    std::__cxx11::string::~string((string *)&local_48);
  }
  if ((this->generator_->debug & 1U) != 0) {
    uVar3 = Stream::line_no(&this->stream_);
    (local_18->super_StmtBlock).super_Stmt.super_IRNode.verilog_ln = uVar3;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range1);
  this_00 = SequentialStmtBlock::get_event_controls(local_18);
  __end1 = std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>::begin(this_00);
  event_control =
       (EventControl *)
       std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>::end(this_00);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<kratos::EventControl_*,_std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>_>
                                *)&event_control);
    if (!bVar2) break;
    this_01 = (SystemVerilogCodeGen *)
              __gnu_cxx::
              __normal_iterator<kratos::EventControl_*,_std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>_>
              ::operator*(&__end1);
    local_98.this = this;
    func.this = this_01;
    std::function<std::__cxx11::string(kratos::Var_const*)>::
    function<kratos::SystemVerilogCodeGen::stmt_code(kratos::SequentialStmtBlock*)::__0&,void>
              ((function<std::__cxx11::string(kratos::Var_const*)> *)
               (sensitive_list_str.field_2._M_local_buf + 8),&local_98);
    EventControl::to_string
              (&local_b8,(EventControl *)this_01,
               (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_kratos::Var_*)>
                *)(sensitive_list_str.field_2._M_local_buf + 8));
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&__range1,
               &local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_kratos::Var_*)>
    ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_kratos::Var_*)>
                 *)((long)&sensitive_list_str.field_2 + 8));
    __gnu_cxx::
    __normal_iterator<kratos::EventControl_*,_std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>_>
    ::operator++(&__end1);
  }
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range1);
  local_108._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_128,", ",&local_129);
  string::
  join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((string *)local_f8,(string *)local_100,local_108,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,in_R8);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator(&local_129);
  cVar1 = Stream::endl(&this->stream_);
  poVar7 = std::operator<<((ostream *)&(this->stream_).super_stringstream.field_0x10,cVar1);
  poVar7 = std::operator<<(poVar7,"always_ff @(");
  poVar7 = std::operator<<(poVar7,(string *)local_f8);
  poVar7 = std::operator<<(poVar7,") begin");
  block_label_abi_cxx11_((string *)&i,this,&local_18->super_StmtBlock);
  poVar7 = std::operator<<(poVar7,(string *)&i);
  cVar1 = Stream::endl(&this->stream_);
  std::operator<<(poVar7,cVar1);
  std::__cxx11::string::~string((string *)&i);
  this->indent_ = this->indent_ + 1;
  local_158 = 0;
  while( true ) {
    uVar5 = local_158;
    uVar8 = StmtBlock::size(&local_18->super_StmtBlock);
    if (uVar8 <= uVar5) break;
    iVar4 = (*(local_18->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[2])
                      (local_18,local_158);
    (**this->_vptr_SystemVerilogCodeGen)(this,CONCAT44(extraout_var,iVar4));
    local_158 = local_158 + 1;
  }
  this->indent_ = this->indent_ - 1;
  local_168 = indent(this);
  pbVar6 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                           &(this->stream_).super_stringstream.field_0x10,local_168);
  poVar7 = std::operator<<(pbVar6,"end");
  block_label_abi_cxx11_(&local_188,this,&local_18->super_StmtBlock);
  poVar7 = std::operator<<(poVar7,(string *)&local_188);
  cVar1 = Stream::endl(&this->stream_);
  std::operator<<(poVar7,cVar1);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)local_f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1);
  return;
}

Assistant:

void SystemVerilogCodeGen::stmt_code(SequentialStmtBlock* stmt) {
    // comment
    if (!stmt->comment.empty()) {
        stream_ << indent() << "// " << strip_newline(stmt->comment) << stream_.endl();
    }
    // produce the sensitive list
    if (generator_->debug) {
        stmt->verilog_ln = stream_.line_no();
    }
    std::vector<std::string> sensitive_list;
    for (const auto& event_control : stmt->get_event_controls()) {
        auto func = [this](const Var* var) { return stream_.var_str(var); };
        sensitive_list.emplace_back(event_control.to_string(func));
    }
    std::string sensitive_list_str =
        string::join(sensitive_list.begin(), sensitive_list.end(), ", ");
    stream_ << stream_.endl() << "always_ff @(" << sensitive_list_str << ") begin"
            << block_label(stmt) << stream_.endl();
    indent_++;

    for (uint64_t i = 0; i < stmt->size(); i++) {
        dispatch_node(stmt->get_child(i));
    }

    indent_--;
    stream_ << indent() << "end" << block_label(stmt) << stream_.endl();
}